

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

TZDBNames * icu_63::TZDBNames::createInstance(UResourceBundle *rb,char *key)

{
  uint uVar1;
  UResourceBundle *resB;
  UChar *pUVar2;
  UResourceBundle *resB_00;
  UChar **buffer;
  TZDBNames *pTVar3;
  char *cs;
  UChar *pUVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  UErrorCode status;
  int32_t len;
  UChar **local_40;
  UResourceBundle *local_38;
  
  if (key == (char *)0x0 || rb == (UResourceBundle *)0x0) {
    return (TZDBNames *)0x0;
  }
  if (*key == '\0') {
    return (TZDBNames *)0x0;
  }
  status = U_ZERO_ERROR;
  len = 0;
  resB = ures_getByKey_63(rb,key,(UResourceBundle *)0x0,&status);
  if (U_ZERO_ERROR < status) {
    return (TZDBNames *)0x0;
  }
  local_40 = (UChar **)uprv_malloc_63(0x10);
  if (local_40 == (UChar **)0x0) {
    return (TZDBNames *)0x0;
  }
  bVar8 = true;
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
    status = U_ZERO_ERROR;
    pUVar2 = ures_getStringByKey_63
                       (resB,(char *)((long)&_ZN6icu_63L14TZDBNAMES_KEYSE_rel +
                                     (long)*(int *)((long)&_ZN6icu_63L14TZDBNAMES_KEYSE_rel + lVar6)
                                     ),&len,&status);
    pUVar4 = (UChar *)0x0;
    if (len != 0 && status < U_ILLEGAL_ARGUMENT_ERROR) {
      bVar8 = false;
      pUVar4 = pUVar2;
    }
    *(UChar **)((long)local_40 + lVar6 * 2) = pUVar4;
  }
  buffer = local_40;
  if (!bVar8) {
    cs = "parseRegions";
    resB_00 = ures_getByKey_63(resB,"parseRegions",(UResourceBundle *)0x0,&status);
    bVar8 = true;
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar1 = ures_getSize_63(resB_00);
      uVar7 = (ulong)uVar1;
      if (((int)uVar1 < 1) ||
         (buffer = (UChar **)uprv_malloc_63(uVar7 * 8), buffer == (UChar **)0x0)) {
        buffer = (UChar **)0x0;
        pUVar4 = (UChar *)cs;
      }
      else {
        for (lVar6 = 0; uVar1 != (uint)lVar6; lVar6 = lVar6 + 1) {
          buffer[lVar6] = (UChar *)0x0;
        }
        uVar5 = 0;
        local_38 = resB;
        while( true ) {
          bVar8 = uVar1 == (uint)uVar5;
          resB = local_38;
          pUVar4 = (UChar *)cs;
          if (bVar8) break;
          status = U_ZERO_ERROR;
          pUVar4 = (UChar *)(uVar5 & 0xffffffff);
          pUVar2 = ures_getStringByIndex_63(resB_00,(uint)uVar5,&len,&status);
          resB = local_38;
          if (U_ZERO_ERROR < status) break;
          cs = (char *)uprv_malloc_63((long)len + 1);
          buffer[uVar5] = (UChar *)cs;
          resB = local_38;
          if ((UChar *)cs == (UChar *)0x0) break;
          u_UCharsToChars_63(pUVar2,cs,len);
          *(undefined1 *)((long)buffer[uVar5] + (long)len) = 0;
          uVar5 = uVar5 + 1;
        }
      }
    }
    else {
      buffer = (UChar **)0x0;
      uVar7 = 0;
      pUVar4 = (UChar *)cs;
    }
    ures_close_63(resB_00);
    ures_close_63(resB);
    if (bVar8) {
      pTVar3 = (TZDBNames *)UMemory::operator_new((UMemory *)0x20,(size_t)pUVar4);
      if (pTVar3 == (TZDBNames *)0x0) {
        return (TZDBNames *)0x0;
      }
      pTVar3->_vptr_TZDBNames = (_func_int **)&PTR__TZDBNames_003c8f20;
      pTVar3->fNames = local_40;
      pTVar3->fRegions = (char **)buffer;
      pTVar3->fNumRegions = (int)uVar7;
      return pTVar3;
    }
    uprv_free_63(local_40);
    uVar5 = 0;
    if (buffer == (UChar **)0x0) {
      return (TZDBNames *)0x0;
    }
    if ((int)uVar7 < 1) {
      uVar7 = uVar5;
    }
    for (; (int)uVar7 != (int)uVar5; uVar5 = uVar5 + 1) {
      uprv_free_63(buffer[uVar5]);
    }
  }
  uprv_free_63(buffer);
  return (TZDBNames *)0x0;
}

Assistant:

TZDBNames*
TZDBNames::createInstance(UResourceBundle* rb, const char* key) {
    if (rb == NULL || key == NULL || *key == 0) {
        return NULL;
    }

    UErrorCode status = U_ZERO_ERROR;

    const UChar **names = NULL;
    char** regions = NULL;
    int32_t numRegions = 0;

    int32_t len = 0;

    UResourceBundle* rbTable = NULL;
    rbTable = ures_getByKey(rb, key, rbTable, &status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    names = (const UChar **)uprv_malloc(sizeof(const UChar*) * TZDBNAMES_KEYS_SIZE);
    UBool isEmpty = TRUE;
    if (names != NULL) {
        for (int32_t i = 0; i < TZDBNAMES_KEYS_SIZE; i++) {
            status = U_ZERO_ERROR;
            const UChar *value = ures_getStringByKey(rbTable, TZDBNAMES_KEYS[i], &len, &status);
            if (U_FAILURE(status) || len == 0) {
                names[i] = NULL;
            } else {
                names[i] = value;
                isEmpty = FALSE;
            }
        }
    }

    if (isEmpty) {
        if (names != NULL) {
            uprv_free(names);
        }
        return NULL;
    }

    UResourceBundle *regionsRes = ures_getByKey(rbTable, "parseRegions", NULL, &status);
    UBool regionError = FALSE;
    if (U_SUCCESS(status)) {
        numRegions = ures_getSize(regionsRes);
        if (numRegions > 0) {
            regions = (char**)uprv_malloc(sizeof(char*) * numRegions);
            if (regions != NULL) {
                char **pRegion = regions;
                for (int32_t i = 0; i < numRegions; i++, pRegion++) {
                    *pRegion = NULL;
                }
                // filling regions
                pRegion = regions;
                for (int32_t i = 0; i < numRegions; i++, pRegion++) {
                    status = U_ZERO_ERROR;
                    const UChar *uregion = ures_getStringByIndex(regionsRes, i, &len, &status);
                    if (U_FAILURE(status)) {
                        regionError = TRUE;
                        break;
                    }
                    *pRegion = (char*)uprv_malloc(sizeof(char) * (len + 1));
                    if (*pRegion == NULL) {
                        regionError = TRUE;
                        break;
                    }
                    u_UCharsToChars(uregion, *pRegion, len);
                    (*pRegion)[len] = 0;
                }
            }
        }
    }
    ures_close(regionsRes);
    ures_close(rbTable);

    if (regionError) {
        if (names != NULL) {
            uprv_free(names);
        }
        if (regions != NULL) {
            char **p = regions;
            for (int32_t i = 0; i < numRegions; p++, i++) {
                uprv_free(*p);
            }
            uprv_free(regions);
        }
        return NULL;
    }

    return new TZDBNames(names, regions, numRegions);
}